

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O0

void __thiscall
Variation::canonify(Variation *this,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
                   *references,bool rightmost)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  byte in_DL;
  long in_RDI;
  ostringstream oss;
  references_it_t it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
  *in_stack_fffffffffffffe08;
  string local_1d0 [48];
  ostringstream local_1a0 [215];
  undefined1 in_stack_ffffffffffffff37;
  NamedDnaSequence *in_stack_ffffffffffffff38;
  Variation *in_stack_ffffffffffffff40;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
  local_28;
  c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
  local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
       ::find(in_stack_fffffffffffffe08,(key_type *)0x2b1110);
  local_28.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
       ::end(in_stack_fffffffffffffe08);
  bVar1 = boost::unordered::iterator_detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    boost::unordered::iterator_detail::
    c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
    ::operator->((c_iterator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NamedDnaSequence_*>_>_>
                  *)0x2b1241);
    canonify(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"Cannot find reference ");
  std::operator<<(poVar2,(string *)(in_RDI + 8));
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Variation::canonify(const boost::unordered_map<std::string,NamedDnaSequence*>& references, bool rightmost) {
	typedef boost::unordered_map<string,NamedDnaSequence*>::const_iterator references_it_t;
	references_it_t it = references.find(chromosome);
	if (it == references.end()) {
		ostringstream oss;
		oss << "Cannot find reference " << chromosome;
		throw runtime_error(oss.str());
	}
	canonify(it->second, rightmost);
}